

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMNormalizer::addOrChangeNamespaceDecl
          (DOMNormalizer *this,XMLCh *prefix,XMLCh *uri,DOMElementImpl *element)

{
  XMLCh XVar1;
  XMLCh XVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  XMLCh *pXVar5;
  XMLBuffer buf;
  XMLBuffer local_58;
  
  if (prefix != L"") {
    pXVar4 = L"";
    pXVar5 = prefix;
    if (prefix == (XMLCh *)0x0) {
LAB_0027cdec:
      if (*pXVar4 == L'\0') goto LAB_0027cece;
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_0027cdec;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
    }
    local_58.fMemoryManager = this->fMemoryManager;
    local_58.fIndex = 0;
    local_58.fCapacity = 0x3ff;
    local_58.fFullSize = 0;
    local_58.fUsed = false;
    local_58.fFullHandler = (XMLBufferFullHandler *)0x0;
    local_58.fBuffer = (XMLCh *)0x0;
    iVar3 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])(local_58.fMemoryManager,0x800);
    local_58.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
    *local_58.fBuffer = L'\0';
    local_58.fIndex = 0;
    XMLBuffer::append(&local_58,L"xmlns");
    if (local_58.fIndex == local_58.fCapacity) {
      XMLBuffer::ensureCapacity(&local_58,1);
    }
    local_58.fBuffer[local_58.fIndex] = L':';
    local_58.fIndex = local_58.fIndex + 1;
    XMLBuffer::append(&local_58,prefix);
    local_58.fBuffer[local_58.fIndex] = L'\0';
    (*(element->super_DOMElement).super_DOMNode._vptr_DOMNode[0x31])
              (element,&XMLUni::fgXMLNSURIName,local_58.fBuffer,uri);
    (*(local_58.fMemoryManager)->_vptr_MemoryManager[4])(local_58.fMemoryManager,local_58.fBuffer);
    return;
  }
LAB_0027cece:
  (*(element->super_DOMElement).super_DOMNode._vptr_DOMNode[0x31])
            (element,&XMLUni::fgXMLNSURIName,&XMLUni::fgXMLNSString,uri);
  return;
}

Assistant:

void DOMNormalizer::addOrChangeNamespaceDecl(const XMLCh* prefix, const XMLCh* uri, DOMElementImpl* element) const {

    if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
        element->setAttributeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString, uri);
    } else {
        XMLBuffer buf(1023, fMemoryManager);
        buf.set(XMLUni::fgXMLNSString);
        buf.append(chColon);
        buf.append(prefix);
        element->setAttributeNS(XMLUni::fgXMLNSURIName, buf.getRawBuffer(), uri);
    }
}